

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateCommand.cxx
# Opt level: O0

cmCTestGenericHandler * __thiscall
cmCTestUpdateCommand::InitializeHandler(cmCTestUpdateCommand *this)

{
  cmCTest *pcVar1;
  cmMakefile *pcVar2;
  cmCTestGenericHandler *this_00;
  reference ppcVar3;
  char *pcVar4;
  ulong uVar5;
  allocator local_4b9;
  string local_4b8;
  allocator local_491;
  string local_490;
  undefined4 local_470;
  allocator local_469;
  string local_468;
  cmCTestGenericHandler *local_448;
  cmCTestGenericHandler *handler;
  string local_438;
  allocator local_411;
  string local_410;
  allocator local_3e9;
  string local_3e8;
  allocator local_3c1;
  string local_3c0;
  allocator local_399;
  string local_398;
  allocator local_371;
  string local_370;
  allocator local_349;
  string local_348;
  allocator local_321;
  string local_320;
  allocator local_2f9;
  string local_2f8;
  allocator local_2d1;
  string local_2d0;
  allocator local_2a9;
  string local_2a8;
  allocator local_281;
  string local_280;
  allocator local_259;
  string local_258;
  allocator local_231;
  string local_230;
  allocator local_209;
  string local_208;
  allocator local_1e1;
  string local_1e0;
  allocator local_1b9;
  string local_1b8;
  allocator local_191;
  string local_190;
  allocator local_169;
  string local_168;
  allocator local_141;
  string local_140;
  allocator local_119;
  string local_118;
  undefined1 local_f8 [8];
  string source_dir;
  string local_d0;
  string local_b0;
  string local_90;
  allocator local_59;
  string local_58;
  string local_38;
  cmCTestUpdateCommand *local_18;
  cmCTestUpdateCommand *this_local;
  
  local_18 = this;
  ppcVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Values,4);
  if (*ppcVar3 == (value_type)0x0) {
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_d0,"CTEST_SOURCE_DIRECTORY",
               (allocator *)(source_dir.field_2._M_local_buf + 0xf));
    pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_b0,pcVar4,(allocator *)(source_dir.field_2._M_local_buf + 0xe));
    cmsys::SystemTools::CollapseFullPath(&local_90,&local_b0);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::SetCTestConfiguration
              (pcVar1,"SourceDirectory",pcVar4,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1)
              );
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)(source_dir.field_2._M_local_buf + 0xe));
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)(source_dir.field_2._M_local_buf + 0xf));
  }
  else {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    ppcVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&(this->super_cmCTestHandlerCommand).Values,4);
    pcVar4 = *ppcVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,pcVar4,&local_59);
    cmsys::SystemTools::CollapseFullPath(&local_38,&local_58);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::SetCTestConfiguration
              (pcVar1,"SourceDirectory",pcVar4,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1)
              );
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"SourceDirectory",&local_119);
  cmCTest::GetCTestConfiguration((string *)local_f8,pcVar1,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"CTEST_UPDATE_COMMAND",&local_141);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"UpdateCommand",&local_140,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,"CTEST_UPDATE_OPTIONS",&local_169);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"UpdateOptions",&local_168,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_190,"CTEST_CVS_COMMAND",&local_191);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"CVSCommand",&local_190,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b8,"CTEST_CVS_UPDATE_OPTIONS",&local_1b9);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"CVSUpdateOptions",&local_1b8,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e0,"CTEST_SVN_COMMAND",&local_1e1);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"SVNCommand",&local_1e0,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,"CTEST_SVN_UPDATE_OPTIONS",&local_209);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"SVNUpdateOptions",&local_208,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_230,"CTEST_SVN_OPTIONS",&local_231);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"SVNOptions",&local_230,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_258,"CTEST_BZR_COMMAND",&local_259);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"BZRCommand",&local_258,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_280,"CTEST_BZR_UPDATE_OPTIONS",&local_281);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"BZRUpdateOptions",&local_280,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a8,"CTEST_GIT_COMMAND",&local_2a9);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"GITCommand",&local_2a8,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d0,"CTEST_GIT_UPDATE_OPTIONS",&local_2d1);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"GITUpdateOptions",&local_2d0,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2f8,"CTEST_GIT_INIT_SUBMODULES",&local_2f9);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"GITInitSubmodules",&local_2f8,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_320,"CTEST_GIT_UPDATE_CUSTOM",&local_321);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"GITUpdateCustom",&local_320,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_348,"CTEST_UPDATE_VERSION_ONLY",&local_349);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"UpdateVersionOnly",&local_348,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_370,"CTEST_HG_COMMAND",&local_371);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"HGCommand",&local_370,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_398,"CTEST_HG_UPDATE_OPTIONS",&local_399);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"HGUpdateOptions",&local_398,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c0,"CTEST_P4_COMMAND",&local_3c1);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"P4Command",&local_3c0,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3e8,"CTEST_P4_UPDATE_OPTIONS",&local_3e9);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"P4UpdateOptions",&local_3e8,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_410,"CTEST_P4_CLIENT",&local_411);
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"P4Client",&local_410,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_438,"CTEST_P4_OPTIONS",(allocator *)((long)&handler + 7));
  cmCTest::SetCTestConfigurationFromCMakeVariable
            (pcVar1,pcVar2,"P4Options",&local_438,
             (bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  std::__cxx11::string::~string((string *)&local_438);
  std::allocator<char>::~allocator((allocator<char> *)((long)&handler + 7));
  local_448 = cmCTest::GetInitializedHandler
                        ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"update");
  if (local_448 == (cmCTestGenericHandler *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_468,"internal CTest error. Cannot instantiate update handler",
               &local_469);
    cmCommand::SetError((cmCommand *)this,&local_468);
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator((allocator<char> *)&local_469);
    this_local = (cmCTestUpdateCommand *)0x0;
  }
  else {
    cmCTestGenericHandler::SetCommand(local_448,(cmCTestCommand *)this);
    uVar5 = std::__cxx11::string::empty();
    this_00 = local_448;
    if ((uVar5 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_4b8,"SourceDirectory",&local_4b9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTestGenericHandler::SetOption(this_00,&local_4b8,pcVar4);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
      cmCTestGenericHandler::SetQuiet
                (local_448,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
      this_local = (cmCTestUpdateCommand *)local_448;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_490,"source directory not specified. Please use SOURCE tag",
                 &local_491);
      cmCommand::SetError((cmCommand *)this,&local_490);
      std::__cxx11::string::~string((string *)&local_490);
      std::allocator<char>::~allocator((allocator<char> *)&local_491);
      this_local = (cmCTestUpdateCommand *)0x0;
    }
  }
  local_470 = 1;
  std::__cxx11::string::~string((string *)local_f8);
  return (cmCTestGenericHandler *)this_local;
}

Assistant:

cmCTestGenericHandler* cmCTestUpdateCommand::InitializeHandler()
{
  if (this->Values[ct_SOURCE]) {
    this->CTest->SetCTestConfiguration(
      "SourceDirectory",
      cmSystemTools::CollapseFullPath(this->Values[ct_SOURCE]).c_str(),
      this->Quiet);
  } else {
    this->CTest->SetCTestConfiguration(
      "SourceDirectory",
      cmSystemTools::CollapseFullPath(
        this->Makefile->GetDefinition("CTEST_SOURCE_DIRECTORY"))
        .c_str(),
      this->Quiet);
  }
  std::string source_dir =
    this->CTest->GetCTestConfiguration("SourceDirectory");

  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "UpdateCommand", "CTEST_UPDATE_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "UpdateOptions", "CTEST_UPDATE_OPTIONS", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "CVSCommand", "CTEST_CVS_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "CVSUpdateOptions", "CTEST_CVS_UPDATE_OPTIONS",
    this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "SVNCommand", "CTEST_SVN_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "SVNUpdateOptions", "CTEST_SVN_UPDATE_OPTIONS",
    this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "SVNOptions", "CTEST_SVN_OPTIONS", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "BZRCommand", "CTEST_BZR_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "BZRUpdateOptions", "CTEST_BZR_UPDATE_OPTIONS",
    this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "GITCommand", "CTEST_GIT_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "GITUpdateOptions", "CTEST_GIT_UPDATE_OPTIONS",
    this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "GITInitSubmodules", "CTEST_GIT_INIT_SUBMODULES",
    this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "GITUpdateCustom", "CTEST_GIT_UPDATE_CUSTOM", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "UpdateVersionOnly", "CTEST_UPDATE_VERSION_ONLY",
    this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "HGCommand", "CTEST_HG_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "HGUpdateOptions", "CTEST_HG_UPDATE_OPTIONS", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "P4Command", "CTEST_P4_COMMAND", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "P4UpdateOptions", "CTEST_P4_UPDATE_OPTIONS", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "P4Client", "CTEST_P4_CLIENT", this->Quiet);
  this->CTest->SetCTestConfigurationFromCMakeVariable(
    this->Makefile, "P4Options", "CTEST_P4_OPTIONS", this->Quiet);

  cmCTestGenericHandler* handler =
    this->CTest->GetInitializedHandler("update");
  if (!handler) {
    this->SetError("internal CTest error. Cannot instantiate update handler");
    return CM_NULLPTR;
  }
  handler->SetCommand(this);
  if (source_dir.empty()) {
    this->SetError("source directory not specified. Please use SOURCE tag");
    return CM_NULLPTR;
  }
  handler->SetOption("SourceDirectory", source_dir.c_str());
  handler->SetQuiet(this->Quiet);
  return handler;
}